

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluCheckGroup(word *pTruth,int nVars,If_Grp_t *g)

{
  int iVar1;
  int local_20b8 [2];
  int P2V [16];
  int V2P [16];
  int local_202c;
  int nCofs;
  int v;
  word pF [1024];
  If_Grp_t *g_local;
  int nVars_local;
  word *pTruth_local;
  
  if ((g->nVars < '\x02') || ('\x06' < g->nVars)) {
    __assert_fail("g->nVars >= 2 && g->nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x590,"void If_CluCheckGroup(word *, int, If_Grp_t *)");
  }
  if (('\x01' < g->nMyu) && (g->nMyu < '\x05')) {
    for (local_202c = 0; local_202c < nVars; local_202c = local_202c + 1) {
      local_20b8[local_202c] = local_202c;
      P2V[(long)local_202c + 0xe] = local_202c;
    }
    If_CluCopy((word *)&nCofs,pTruth,nVars);
    If_CluMoveGroupToMsb((word *)&nCofs,nVars,P2V + 0xe,local_20b8,g);
    iVar1 = If_CluCountCofs((word *)&nCofs,nVars,(int)g->nVars,0,(word (*) [256])0x0);
    if (iVar1 != g->nMyu) {
      printf("Group check 0 has failed.\n");
    }
    if (2 < iVar1) {
      iVar1 = If_CluCountCofs((word *)&nCofs,nVars + -1,g->nVars + -1,0,(word (*) [256])0x0);
      if (2 < iVar1) {
        printf("Group check 1 has failed.\n");
      }
      iVar1 = If_CluCountCofs((word *)&nCofs,nVars + -1,g->nVars + -1,1 << ((char)nVars - 1U & 0x1f)
                              ,(word (*) [256])0x0);
      if (2 < iVar1) {
        printf("Group check 2 has failed.\n");
      }
    }
    return;
  }
  __assert_fail("g->nMyu >= 2 && g->nMyu <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x591,"void If_CluCheckGroup(word *, int, If_Grp_t *)");
}

Assistant:

void If_CluCheckGroup( word * pTruth, int nVars, If_Grp_t * g )
{
    word pF[CLU_WRD_MAX];
    int v, nCofs, V2P[CLU_VAR_MAX], P2V[CLU_VAR_MAX];
    assert( g->nVars >= 2 && g->nVars <= 6 ); // vars
    assert( g->nMyu >= 2 && g->nMyu <= 4 ); // cofs
    // create permutation
    for ( v = 0; v < nVars; v++ )
        V2P[v] = P2V[v] = v;
    // create truth table
    If_CluCopy( pF, pTruth, nVars );
    // move group up
    If_CluMoveGroupToMsb( pF, nVars, V2P, P2V, g );
    // check the number of cofactors
    nCofs = If_CluCountCofs( pF, nVars, g->nVars, 0, NULL );
    if ( nCofs != g->nMyu )
        printf( "Group check 0 has failed.\n" );
    // check compatible
    if ( nCofs > 2 )
    {
        nCofs = If_CluCountCofs( pF, nVars-1, g->nVars-1, 0, NULL );
        if ( nCofs > 2 )
            printf( "Group check 1 has failed.\n" );
        nCofs = If_CluCountCofs( pF, nVars-1, g->nVars-1, (1 << (nVars-1)), NULL );
        if ( nCofs > 2 )
            printf( "Group check 2 has failed.\n" );
    }
}